

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvsDiurnal_FSA_kry.c
# Opt level: O1

void FreeUserData(UserData data)

{
  long lVar1;
  sunindextype *(*papsVar2) [15];
  long lVar3;
  
  papsVar2 = data->pivot;
  lVar3 = 0;
  do {
    lVar1 = 0;
    do {
      SUNDlsMat_destroyMat((*(sunrealtype **(*) [15])(papsVar2 + -0x1e))[lVar1]);
      SUNDlsMat_destroyMat((*(sunrealtype **(*) [15])(papsVar2 + -0xf))[lVar1]);
      SUNDlsMat_destroyArray((*papsVar2)[lVar1]);
      lVar1 = lVar1 + 1;
    } while (lVar1 != 0xf);
    lVar3 = lVar3 + 1;
    papsVar2 = papsVar2 + 1;
  } while (lVar3 != 0xf);
  free(data->p);
  free(data);
  return;
}

Assistant:

static void FreeUserData(UserData data)
{
  int jx, jz;

  for (jx = 0; jx < MX; jx++)
  {
    for (jz = 0; jz < MZ; jz++)
    {
      SUNDlsMat_destroyMat((data->P)[jx][jz]);
      SUNDlsMat_destroyMat((data->Jbd)[jx][jz]);
      SUNDlsMat_destroyArray((data->pivot)[jx][jz]);
    }
  }

  free(data->p);

  free(data);
}